

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_memset(void *ptr,int c0,nk_size size)

{
  ulong uVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  
  uVar2 = CONCAT44(in_register_00000034,c0);
  if (uVar2 < 0xc) {
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      *(undefined1 *)((long)ptr + uVar1) = 0;
    }
  }
  else {
    uVar1 = (ulong)ptr & 3;
    if (uVar1 != 0) {
      memset(ptr,0,4 - uVar1);
      uVar2 = uVar2 - (4 - uVar1);
      ptr = (void *)((long)ptr + (4 - uVar1));
    }
    memset(ptr,0,uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 3) != 0) {
      memset((void *)((long)ptr + (uVar2 & 0xfffffffffffffffc)),0,uVar2 & 3);
      return;
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_memset(void *ptr, int c0, nk_size size)
{
    #define nk_word unsigned
    #define nk_wsize sizeof(nk_word)
    #define nk_wmask (nk_wsize - 1)
    nk_byte *dst = (nk_byte*)ptr;
    unsigned c = 0;
    nk_size t = 0;

    if ((c = (nk_byte)c0) != 0) {
        c = (c << 8) | c; /* at least 16-bits  */
        if (sizeof(unsigned int) > 2)
            c = (c << 16) | c; /* at least 32-bits*/
    }

    /* too small of a word count */
    dst = (nk_byte*)ptr;
    if (size < 3 * nk_wsize) {
        while (size--) *dst++ = (nk_byte)c0;
        return;
    }

    /* align destination */
    if ((t = NK_PTR_TO_UINT(dst) & nk_wmask) != 0) {
        t = nk_wsize -t;
        size -= t;
        do {
            *dst++ = (nk_byte)c0;
        } while (--t != 0);
    }

    /* fill word */
    t = size / nk_wsize;
    do {
        *(nk_word*)((void*)dst) = c;
        dst += nk_wsize;
    } while (--t != 0);

    /* fill trailing bytes */
    t = (size & nk_wmask);
    if (t != 0) {
        do {
            *dst++ = (nk_byte)c0;
        } while (--t != 0);
    }

    #undef nk_word
    #undef nk_wsize
    #undef nk_wmask
}